

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  undefined8 __s;
  bool bVar2;
  TargetType TVar3;
  cmComputeLinkInformation *pcli_00;
  string *psVar4;
  ulong uVar5;
  undefined1 local_6b0 [8];
  string extraLinkFlags;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkOpts_1;
  cmAlphaNum local_648;
  string local_618;
  string *local_5f8;
  allocator<char> local_5e9;
  string local_5e8;
  cmValue local_5c8;
  cmValue targetLinkFlags_1;
  string cmp0065Flags;
  undefined1 local_580 [8];
  string sFlagVar;
  string local_558;
  cmAlphaNum local_538;
  cmAlphaNum local_508;
  string local_4d8;
  cmAlphaNum local_4b8;
  cmAlphaNum local_488;
  string local_458;
  cmAlphaNum local_438;
  cmAlphaNum local_408;
  string local_3d8;
  int local_3b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  cmAlphaNum local_390;
  cmAlphaNum local_360;
  string local_330;
  allocator<char> local_309;
  string local_308;
  undefined1 local_2e8 [8];
  string exeFlags;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkOpts;
  cmAlphaNum local_280;
  string local_250;
  string *local_230;
  allocator<char> local_221;
  string local_220;
  cmValue local_200;
  cmValue targetLinkFlags;
  cmAlphaNum local_1c8;
  undefined1 local_198 [8];
  string build;
  allocator<char> local_141;
  string local_140;
  cmAlphaNum local_120;
  string local_f0;
  undefined1 local_d0 [8];
  string sharedLibFlags;
  undefined1 local_98 [8];
  string linkLanguage;
  char *libraryLinkVariable;
  cmComputeLinkInformation *pcli;
  string configUpper;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkFlags_local;
  string *flags_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkLibs_local;
  string *config_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmLocalGenerator *this_local;
  
  configUpper.field_2._8_8_ = linkFlags;
  cmsys::SystemTools::UpperCase((string *)&pcli,config);
  pcli_00 = cmGeneratorTarget::GetLinkInformation(target,config);
  linkLanguage.field_2._8_8_ = anon_var_dwarf_5f4e5d;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(local_98,linkLineComputer,target,config);
  TVar3 = cmGeneratorTarget::GetType(target);
  switch(TVar3) {
  case EXECUTABLE:
    std::__cxx11::string::string((string *)local_2e8);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"Swift");
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"CMAKE_EXE_LINKER_FLAGS",&local_309);
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_308);
      std::__cxx11::string::operator=((string *)local_2e8,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
      std::__cxx11::string::operator+=((string *)local_2e8," ");
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar1 = this->Makefile;
        cmAlphaNum::cmAlphaNum(&local_360,"CMAKE_EXE_LINKER_FLAGS_");
        cmAlphaNum::cmAlphaNum(&local_390,(string *)&pcli);
        cmStrCat<>(&local_330,&local_360,&local_390);
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_330);
        std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::operator+=((string *)local_2e8," ");
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        bVar2 = cmGeneratorTarget::IsWin32Executable(target,config);
        if (bVar2) {
          pcVar1 = this->Makefile;
          cmAlphaNum::cmAlphaNum(&local_408,"CMAKE_");
          cmAlphaNum::cmAlphaNum(&local_438,(string *)local_98);
          cmStrCat<char[18]>(&local_3d8,&local_408,&local_438,(char (*) [18])"_CREATE_WIN32_EXE");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_3d8);
          std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::operator+=((string *)local_2e8," ");
        }
        else {
          pcVar1 = this->Makefile;
          cmAlphaNum::cmAlphaNum(&local_488,"CMAKE_");
          cmAlphaNum::cmAlphaNum(&local_4b8,(string *)local_98);
          cmStrCat<char[20]>(&local_458,&local_488,&local_4b8,(char (*) [20])"_CREATE_CONSOLE_EXE");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_458);
          std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::operator+=((string *)local_2e8," ");
        }
        bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
        if (bVar2) {
          pcVar1 = this->Makefile;
          cmAlphaNum::cmAlphaNum(&local_508,"CMAKE_EXE_EXPORTS_");
          cmAlphaNum::cmAlphaNum(&local_538,(string *)local_98);
          cmStrCat<char[6]>(&local_4d8,&local_508,&local_538,(char (*) [6])0xd5699f);
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_4d8);
          std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::operator+=((string *)local_2e8," ");
        }
        goto LAB_003d2696;
      }
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      std::operator+(&local_3b0,"CMake can not determine linker language for target: ",psVar4);
      cmSystemTools::Error(&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      local_3b4 = 1;
    }
    else {
LAB_003d2696:
      AddLanguageFlagsForLinking(this,flags,target,(string *)local_98,config);
      if (pcli_00 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
      }
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"BUILD_SHARED_LIBS",
                 (allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
      bVar2 = cmMakefile::IsOn(pcVar1,&local_558);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator((allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmp0065Flags.field_2 + 8),"CMAKE_SHARED_BUILD_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_580,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmp0065Flags.field_2 + 8),"_FLAGS");
        std::__cxx11::string::~string((string *)(cmp0065Flags.field_2._M_local_buf + 8));
        psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_580);
        std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_2e8," ");
        std::__cxx11::string::~string((string *)local_580);
      }
      GetLinkLibsCMP0065((string *)&targetLinkFlags_1,this,(string *)local_98,target);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_2e8,(string *)&targetLinkFlags_1);
        std::__cxx11::string::operator+=((string *)local_2e8," ");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,"LINK_FLAGS",&local_5e9);
      local_5c8 = cmGeneratorTarget::GetProperty(target,&local_5e8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator(&local_5e9);
      bVar2 = cmValue::operator_cast_to_bool(&local_5c8);
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_5c8);
        std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_2e8," ");
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_648,"LINK_FLAGS_");
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)
                   &linkOpts_1.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&pcli);
        cmStrCat<>(&local_618,&local_648,
                   (cmAlphaNum *)
                   &linkOpts_1.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_5f8 = (string *)cmGeneratorTarget::GetProperty(target,&local_618);
        local_5c8 = (cmValue)local_5f8;
        std::__cxx11::string::~string((string *)&local_618);
        bVar2 = cmValue::operator_cast_to_bool(&local_5c8);
        if (bVar2) {
          psVar4 = cmValue::operator*[abi_cxx11_(&local_5c8);
          std::__cxx11::string::operator+=((string *)local_2e8,(string *)psVar4);
          std::__cxx11::string::operator+=((string *)local_2e8," ");
        }
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   configUpper.field_2._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&extraLinkFlags.field_2 + 8),target,config,(string *)local_98);
      AppendCompileOptions
                (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)configUpper.field_2._8_8_,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&extraLinkFlags.field_2 + 8),(char *)0x0);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&extraLinkFlags.field_2 + 8));
      std::__cxx11::string::~string((string *)&targetLinkFlags_1);
      local_3b4 = 0;
    }
    std::__cxx11::string::~string((string *)local_2e8);
    if (local_3b4 != 0) goto LAB_003d2c85;
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&sharedLibFlags.field_2 + 8),this,config,(string *)local_98,target);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)configUpper.field_2._8_8_,
                (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&sharedLibFlags.field_2 + 8));
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&sharedLibFlags.field_2 + 8));
    break;
  case MODULE_LIBRARY:
    linkLanguage.field_2._8_8_ = anon_var_dwarf_5f4e6a;
  case SHARED_LIBRARY:
    std::__cxx11::string::string((string *)local_d0);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"Swift");
    __s = linkLanguage.field_2._8_8_;
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,(char *)__s,&local_141);
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_140);
      cmAlphaNum::cmAlphaNum(&local_120,psVar4);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&build.field_2 + 8),' ');
      cmStrCat<>(&local_f0,&local_120,(cmAlphaNum *)((long)&build.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_1c8,(char *)linkLanguage.field_2._8_8_);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&targetLinkFlags,'_');
        cmStrCat<std::__cxx11::string>
                  ((string *)local_198,&local_1c8,(cmAlphaNum *)&targetLinkFlags,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcli);
        psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_198);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_d0," ");
        std::__cxx11::string::~string((string *)local_198);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"LINK_FLAGS",&local_221)
    ;
    local_200 = cmGeneratorTarget::GetProperty(target,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    bVar2 = cmValue::operator_cast_to_bool(&local_200);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_200);
      std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_d0," ");
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_280,"LINK_FLAGS_");
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)
                 &linkOpts.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&pcli);
      cmStrCat<>(&local_250,&local_280,
                 (cmAlphaNum *)
                 &linkOpts.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_230 = (string *)cmGeneratorTarget::GetProperty(target,&local_250);
      local_200 = (cmValue)local_230;
      std::__cxx11::string::~string((string *)&local_250);
      bVar2 = cmValue::operator_cast_to_bool(&local_200);
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_200);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_d0," ");
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 configUpper.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    }
    cmGeneratorTarget::GetLinkOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&exeFlags.field_2 + 8),target,config,(string *)local_98);
    AppendCompileOptions
              (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)configUpper.field_2._8_8_,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&exeFlags.field_2 + 8),(char *)0x0);
    if (pcli_00 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&exeFlags.field_2 + 8));
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__cxx11::string::string((string *)local_6b0);
  AppendPositionIndependentLinkerFlags(this,(string *)local_6b0,target,config,(string *)local_98);
  AppendIPOLinkerFlags(this,(string *)local_6b0,target,config,(string *)local_98);
  AppendModuleDefinitionFlag(this,(string *)local_6b0,target,linkLineComputer,config);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               configUpper.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0);
  }
  std::__cxx11::string::~string((string *)local_6b0);
  local_3b4 = 0;
LAB_003d2c85:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&pcli);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}